

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O0

void fl_open_display(Display *d)

{
  int iVar1;
  code *pcVar2;
  code *pcVar3;
  XRRSelectInput_type XRRSelectInput_f;
  XRRQueryExtension_type XRRQueryExtension_f;
  long lStack_60;
  int error_base_1;
  void *libxrandr_addr;
  int error_base;
  int num;
  XVisualInfo templt;
  Display *d_local;
  
  fl_display = d;
  templt._56_8_ = d;
  WM_DELETE_WINDOW = XInternAtom(d,"WM_DELETE_WINDOW",0);
  WM_PROTOCOLS = XInternAtom(templt._56_8_,"WM_PROTOCOLS",0);
  fl_MOTIF_WM_HINTS = XInternAtom(templt._56_8_,"_MOTIF_WM_HINTS",0);
  TARGETS = XInternAtom(templt._56_8_,"TARGETS",0);
  CLIPBOARD = XInternAtom(templt._56_8_,"CLIPBOARD",0);
  TIMESTAMP = XInternAtom(templt._56_8_,"TIMESTAMP",0);
  PRIMARY_TIMESTAMP = XInternAtom(templt._56_8_,"PRIMARY_TIMESTAMP",0);
  CLIPBOARD_TIMESTAMP = XInternAtom(templt._56_8_,"CLIPBOARD_TIMESTAMP",0);
  fl_XdndAware = XInternAtom(templt._56_8_,"XdndAware",0);
  fl_XdndSelection = XInternAtom(templt._56_8_,"XdndSelection",0);
  fl_XdndEnter = XInternAtom(templt._56_8_,"XdndEnter",0);
  fl_XdndTypeList = XInternAtom(templt._56_8_,"XdndTypeList",0);
  fl_XdndPosition = XInternAtom(templt._56_8_,"XdndPosition",0);
  fl_XdndLeave = XInternAtom(templt._56_8_,"XdndLeave",0);
  fl_XdndDrop = XInternAtom(templt._56_8_,"XdndDrop",0);
  fl_XdndStatus = XInternAtom(templt._56_8_,"XdndStatus",0);
  fl_XdndActionCopy = XInternAtom(templt._56_8_,"XdndActionCopy",0);
  fl_XdndFinished = XInternAtom(templt._56_8_,"XdndFinished",0);
  fl_XdndEnter = XInternAtom(templt._56_8_,"XdndEnter",0);
  fl_XdndURIList = XInternAtom(templt._56_8_,"text/uri-list",0);
  fl_Xatextplainutf = XInternAtom(templt._56_8_,"text/plain;charset=UTF-8",0);
  fl_Xatextplainutf2 = XInternAtom(templt._56_8_,"text/plain;charset=utf-8",0);
  fl_Xatextplain = XInternAtom(templt._56_8_,"text/plain",0);
  fl_XaText = XInternAtom(templt._56_8_,"TEXT",0);
  fl_XaCompoundText = XInternAtom(templt._56_8_,"COMPOUND_TEXT",0);
  fl_XaUtf8String = XInternAtom(templt._56_8_,"UTF8_STRING",0);
  fl_XaTextUriList = XInternAtom(templt._56_8_,"text/uri-list",0);
  fl_XaImageBmp = XInternAtom(templt._56_8_,"image/bmp",0);
  fl_XaImagePNG = XInternAtom(templt._56_8_,"image/png",0);
  fl_INCR = XInternAtom(templt._56_8_,"INCR",0);
  fl_NET_WM_PID = XInternAtom(templt._56_8_,"_NET_WM_PID",0);
  fl_NET_WM_NAME = XInternAtom(templt._56_8_,"_NET_WM_NAME",0);
  fl_NET_WM_ICON_NAME = XInternAtom(templt._56_8_,"_NET_WM_ICON_NAME",0);
  fl_NET_SUPPORTING_WM_CHECK = XInternAtom(templt._56_8_,"_NET_SUPPORTING_WM_CHECK",0);
  fl_NET_WM_STATE = XInternAtom(templt._56_8_,"_NET_WM_STATE",0);
  fl_NET_WM_STATE_FULLSCREEN = XInternAtom(templt._56_8_,"_NET_WM_STATE_FULLSCREEN",0);
  fl_NET_WM_FULLSCREEN_MONITORS = XInternAtom(templt._56_8_,"_NET_WM_FULLSCREEN_MONITORS",0);
  fl_NET_WORKAREA = XInternAtom(templt._56_8_,"_NET_WORKAREA",0);
  fl_NET_WM_ICON = XInternAtom(templt._56_8_,"_NET_WM_ICON",0);
  fl_NET_ACTIVE_WINDOW = XInternAtom(templt._56_8_,"_NET_ACTIVE_WINDOW",0);
  Fl::add_fd(*(int *)(templt._56_8_ + 0x10),1,fd_callback,(void *)0x0);
  fl_screen = *(int *)(templt._56_8_ + 0xe0);
  fl_message_window =
       XCreateSimpleWindow(templt._56_8_,
                           *(undefined8 *)
                            (*(long *)(templt._56_8_ + 0xe8) + (long)fl_screen * 0x80 + 0x10),0,0,1,
                           1,0,0,0);
  templt.visual =
       (Visual *)
       XVisualIDFromVisual(*(undefined8 *)
                            (*(long *)(templt._56_8_ + 0xe8) + (long)fl_screen * 0x80 + 0x40));
  fl_visual = (XVisualInfo *)XGetVisualInfo(templt._56_8_,1,&error_base,(long)&libxrandr_addr + 4);
  fl_colormap = *(Colormap *)(*(long *)(templt._56_8_ + 0xe8) + (long)fl_screen * 0x80 + 0x50);
  fl_init_xim();
  iVar1 = XFixesQueryExtension(fl_display,&xfixes_event_base,&libxrandr_addr);
  have_xfixes = iVar1 != 0;
  lStack_60 = dlopen("libXrandr.so.2",1);
  if (lStack_60 == 0) {
    lStack_60 = dlopen("libXrandr.so",1);
  }
  if (lStack_60 != 0) {
    pcVar2 = (code *)dlsym(lStack_60,"XRRQueryExtension");
    pcVar3 = (code *)dlsym(lStack_60,"XRRSelectInput");
    XRRUpdateConfiguration_f =
         (XRRUpdateConfiguration_type)dlsym(lStack_60,"XRRUpdateConfiguration");
    if (((pcVar2 == (code *)0x0) || (pcVar3 == (code *)0x0)) ||
       (iVar1 = (*pcVar2)(templt._56_8_,&randrEventBase,(long)&XRRQueryExtension_f + 4), iVar1 == 0)
       ) {
      XRRUpdateConfiguration_f = (XRRUpdateConfiguration_type)0x0;
    }
    else {
      (*pcVar3)(templt._56_8_,
                *(undefined8 *)(*(long *)(templt._56_8_ + 0xe8) + (long)fl_screen * 0x80 + 0x10),1);
    }
  }
  XSelectInput(templt._56_8_,
               *(undefined8 *)(*(long *)(templt._56_8_ + 0xe8) + (long)fl_screen * 0x80 + 0x10),
               0x400000);
  return;
}

Assistant:

void fl_open_display(Display* d) {
  fl_display = d;

  WM_DELETE_WINDOW      = XInternAtom(d, "WM_DELETE_WINDOW",    0);
  WM_PROTOCOLS          = XInternAtom(d, "WM_PROTOCOLS",        0);
  fl_MOTIF_WM_HINTS     = XInternAtom(d, "_MOTIF_WM_HINTS",     0);
  TARGETS               = XInternAtom(d, "TARGETS",             0);
  CLIPBOARD             = XInternAtom(d, "CLIPBOARD",           0);
  TIMESTAMP             = XInternAtom(d, "TIMESTAMP",           0);
  PRIMARY_TIMESTAMP     = XInternAtom(d, "PRIMARY_TIMESTAMP",   0);
  CLIPBOARD_TIMESTAMP   = XInternAtom(d, "CLIPBOARD_TIMESTAMP", 0);
  fl_XdndAware          = XInternAtom(d, "XdndAware",           0);
  fl_XdndSelection      = XInternAtom(d, "XdndSelection",       0);
  fl_XdndEnter          = XInternAtom(d, "XdndEnter",           0);
  fl_XdndTypeList       = XInternAtom(d, "XdndTypeList",        0);
  fl_XdndPosition       = XInternAtom(d, "XdndPosition",        0);
  fl_XdndLeave          = XInternAtom(d, "XdndLeave",           0);
  fl_XdndDrop           = XInternAtom(d, "XdndDrop",            0);
  fl_XdndStatus         = XInternAtom(d, "XdndStatus",          0);
  fl_XdndActionCopy     = XInternAtom(d, "XdndActionCopy",      0);
  fl_XdndFinished       = XInternAtom(d, "XdndFinished",        0);
  //fl_XdndProxy        = XInternAtom(d, "XdndProxy",           0);
  fl_XdndEnter          = XInternAtom(d, "XdndEnter",           0);
  fl_XdndURIList        = XInternAtom(d, "text/uri-list",       0);
  fl_Xatextplainutf     = XInternAtom(d, "text/plain;charset=UTF-8",0);
  fl_Xatextplainutf2    = XInternAtom(d, "text/plain;charset=utf-8",0);	// Firefox/Thunderbird needs this - See STR#2930
  fl_Xatextplain        = XInternAtom(d, "text/plain",          0);
  fl_XaText             = XInternAtom(d, "TEXT",                0);
  fl_XaCompoundText     = XInternAtom(d, "COMPOUND_TEXT",       0);
  fl_XaUtf8String       = XInternAtom(d, "UTF8_STRING",         0);
  fl_XaTextUriList      = XInternAtom(d, "text/uri-list",       0);
  fl_XaImageBmp         = XInternAtom(d, "image/bmp",           0);
  fl_XaImagePNG         = XInternAtom(d, "image/png",           0);
  fl_INCR               = XInternAtom(d, "INCR",                0);
  fl_NET_WM_PID         = XInternAtom(d, "_NET_WM_PID",         0);
  fl_NET_WM_NAME        = XInternAtom(d, "_NET_WM_NAME",        0);
  fl_NET_WM_ICON_NAME   = XInternAtom(d, "_NET_WM_ICON_NAME",   0);
  fl_NET_SUPPORTING_WM_CHECK = XInternAtom(d, "_NET_SUPPORTING_WM_CHECK", 0);
  fl_NET_WM_STATE       = XInternAtom(d, "_NET_WM_STATE",       0);
  fl_NET_WM_STATE_FULLSCREEN = XInternAtom(d, "_NET_WM_STATE_FULLSCREEN", 0);
  fl_NET_WM_FULLSCREEN_MONITORS = XInternAtom(d, "_NET_WM_FULLSCREEN_MONITORS", 0);
  fl_NET_WORKAREA       = XInternAtom(d, "_NET_WORKAREA",       0);
  fl_NET_WM_ICON        = XInternAtom(d, "_NET_WM_ICON",        0);
  fl_NET_ACTIVE_WINDOW  = XInternAtom(d, "_NET_ACTIVE_WINDOW",  0);

  if (sizeof(Atom) < 4)
    atom_bits = sizeof(Atom) * 8;

  Fl::add_fd(ConnectionNumber(d), POLLIN, fd_callback);

  fl_screen = DefaultScreen(d);

  fl_message_window =
    XCreateSimpleWindow(d, RootWindow(d,fl_screen), 0,0,1,1,0, 0, 0);

// construct an XVisualInfo that matches the default Visual:
  XVisualInfo templt; int num;
  templt.visualid = XVisualIDFromVisual(DefaultVisual(d, fl_screen));
  fl_visual = XGetVisualInfo(d, VisualIDMask, &templt, &num);
  fl_colormap = DefaultColormap(d, fl_screen);
  fl_init_xim();

#if !USE_COLORMAP
  Fl::visual(FL_RGB);
#endif

#if HAVE_XFIXES
  int error_base;
  if (XFixesQueryExtension(fl_display, &xfixes_event_base, &error_base))
    have_xfixes = true;
  else
    have_xfixes = false;
#endif

#if USE_XRANDR
  void *libxrandr_addr = dlopen("libXrandr.so.2", RTLD_LAZY);
  if (!libxrandr_addr)  libxrandr_addr = dlopen("libXrandr.so", RTLD_LAZY);
  if (libxrandr_addr) {
    int error_base;
    typedef Bool (*XRRQueryExtension_type)(Display*, int*, int*);
    typedef void (*XRRSelectInput_type)(Display*, Window, int);
    XRRQueryExtension_type XRRQueryExtension_f = (XRRQueryExtension_type)dlsym(libxrandr_addr, "XRRQueryExtension");
    XRRSelectInput_type XRRSelectInput_f = (XRRSelectInput_type)dlsym(libxrandr_addr, "XRRSelectInput");
    XRRUpdateConfiguration_f = (XRRUpdateConfiguration_type)dlsym(libxrandr_addr, "XRRUpdateConfiguration");
    if (XRRQueryExtension_f && XRRSelectInput_f && XRRQueryExtension_f(d, &randrEventBase, &error_base))
      XRRSelectInput_f(d, RootWindow(d, fl_screen), RRScreenChangeNotifyMask);
    else XRRUpdateConfiguration_f = NULL;
    }
#endif

  // Listen for changes to _NET_WORKAREA
  XSelectInput(d, RootWindow(d, fl_screen), PropertyChangeMask);
}